

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

bool __thiscall flow::lang::Lexer::ipv6HexSeq(Lexer *this)

{
  bool bVar1;
  int iVar2;
  Lexer *this_local;
  
  bVar1 = ipv6HexDigit4(this);
  if (bVar1) {
    do {
      iVar2 = currentChar(this);
      bVar1 = false;
      if (iVar2 == 0x3a) {
        iVar2 = peekChar(this);
        bVar1 = iVar2 != 0x3a;
      }
      if (!bVar1) {
        return true;
      }
      std::__cxx11::string::operator+=((string *)&this->stringValue_,':');
      nextChar(this,true);
      bVar1 = ipv6HexDigit4(this);
    } while (bVar1);
  }
  return false;
}

Assistant:

bool Lexer::ipv6HexSeq() {
  if (!ipv6HexDigit4()) return false;

  while (currentChar() == ':' && peekChar() != ':') {
    stringValue_ += ':';
    nextChar();

    if (!ipv6HexDigit4()) return false;
  }

  return true;
}